

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::TryGetSafeCopy(LTFlightData *this,FDStaticData *outStat)

{
  bool bVar1;
  unique_lock<std::recursive_mutex> lock;
  
  lock._M_device = &this->dataAccessMutex;
  lock._M_owns = std::recursive_mutex::try_lock(lock._M_device);
  bVar1 = !lock._M_owns;
  if (bVar1) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  }
  else {
    FDStaticData::operator=(outStat,&this->statData);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  }
  return !bVar1;
}

Assistant:

bool LTFlightData::TryGetSafeCopy ( LTFlightData::FDStaticData& outStat ) const
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( lock )
        {
            // we got the lock, return a copy of the data
            outStat = statData;
            // Success!
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}